

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::InterpolationRecord::
InterpolationRecord<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (InterpolationRecord *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *end,long *lineNumber,int MAT,int MF,int MT)

{
  record::InterpolationBase::
  InterpolationBase<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&this->super_InterpolationBase,it,end,lineNumber,MAT,MF,MT);
  return;
}

Assistant:

InterpolationRecord
( Iterator& it, const Iterator& end, long& lineNumber,
  int MAT, int MF, int MT )
  try :
    InterpolationBase( it, end, lineNumber, MAT, MF, MT ) {}
  catch ( IllegalN2& e ) {
    Log::error( "Illegal NZ value encountered" );
    Log::info( "NZ (or number of zones) must be greater than or equal to 1" );
    Log::info( "NZ value: {}", e.n2 );
    Log::info( "Error encountered while parsing TAB2 record" );
    throw std::exception();
  }
  catch ( InconsistentN2& e ) {
    Log::error( "Inconsistent value for NZ" );
    Log::info( "Expected {} as the largest index but found {}", e.n2, e.index );
    Log::info( "Error encountered while parsing TAB2 record" );
    throw std::exception();
  }
  catch ( int nPosition ){
    Log::info( "Error in position {}", nPosition );
    Log::info( "Error encountered while parsing TAB2 record" );
    throw std::exception();
  }
  catch ( std::exception& e ) {
    Log::info( "Error encountered while parsing TAB2 record" );
    throw e;
  }